

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall MCU::idct(MCU *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  void *extraout_RDX_01;
  ulong uVar5;
  BLOCK (*paaaadVar6) [2] [2];
  long lVar7;
  int y;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double s [8] [8];
  double tmp [8] [8];
  long local_4a8;
  long local_4a0;
  ulong local_498;
  BLOCK (*local_480) [2] [2];
  BLOCK (*local_478) [2] [2];
  BLOCK (*local_470) [2] [2];
  double local_438 [64];
  double local_238 [65];
  
  lVar2 = 1;
  local_4a0 = 0;
  local_480 = this->mcu + 1;
  do {
    if (subVector[lVar2].height != '\0') {
      local_478 = local_480;
      local_498 = 0;
      do {
        if (subVector[lVar2].width != '\0') {
          local_470 = local_478;
          uVar5 = 0;
          do {
            memset(local_238,0,0x200);
            memset(local_438,0,0x200);
            lVar7 = 8;
            lVar1 = 0;
            pvVar4 = extraout_RDX;
            do {
              lVar3 = 0;
              paaaadVar6 = local_470;
              do {
                pdVar10 = cos_cache;
                uVar8 = 0;
                do {
                  c(this,(void *)(uVar8 & 0xffffffff),pvVar4);
                  local_438[lVar1 * 8 + lVar3] =
                       extraout_XMM0_Qa * (*paaaadVar6)[0][0][0][uVar8] * *pdVar10 +
                       local_438[lVar1 * 8 + lVar3];
                  uVar8 = uVar8 + 1;
                  pdVar10 = (double *)((long)pdVar10 + lVar7);
                  pvVar4 = extraout_RDX_00;
                } while (uVar8 != 8);
                local_438[lVar1 * 8 + lVar3] = local_438[lVar1 * 8 + lVar3] * 0.5;
                lVar3 = lVar3 + 1;
                paaaadVar6 = (BLOCK (*) [2] [2])((*paaaadVar6)[0][0] + 1);
              } while (lVar3 != 8);
              lVar1 = lVar1 + 1;
              lVar7 = lVar7 + 0x10;
            } while (lVar1 != 8);
            lVar1 = 8;
            local_4a8 = 0;
            do {
              pdVar10 = local_438;
              lVar7 = 0;
              do {
                pdVar9 = cos_cache;
                uVar8 = 0;
                do {
                  c(this,(void *)(uVar8 & 0xffffffff),pvVar4);
                  local_238[local_4a8 * 8 + lVar7] =
                       extraout_XMM0_Qa_00 * pdVar10[uVar8] * *pdVar9 +
                       local_238[local_4a8 * 8 + lVar7];
                  uVar8 = uVar8 + 1;
                  pdVar9 = (double *)((long)pdVar9 + lVar1);
                  pvVar4 = extraout_RDX_01;
                } while (uVar8 != 8);
                local_238[local_4a8 * 8 + lVar7] = local_238[local_4a8 * 8 + lVar7] * 0.5;
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 8;
              } while (lVar7 != 8);
              local_4a8 = local_4a8 + 1;
              lVar1 = lVar1 + 0x10;
            } while (local_4a8 != 8);
            memcpy((this->mcu + 1)[local_4a0][local_498] + uVar5,local_238,0x200);
            uVar5 = uVar5 + 1;
            local_470 = (BLOCK (*) [2] [2])((*local_470)[0] + 1);
          } while (uVar5 < subVector[lVar2].width);
        }
        local_498 = local_498 + 1;
        local_478 = (BLOCK (*) [2] [2])(*local_478 + 1);
      } while (local_498 < subVector[lVar2].height);
    }
    lVar2 = lVar2 + 1;
    local_4a0 = local_4a0 + 1;
    local_480 = local_480 + 1;
  } while (local_4a0 != 3);
  return;
}

Assistant:

void idct() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    double tmp[8][8] = {0};
//					 照定義展開，效能低下
//                     for (int i = 0; i < 8; i++) {
//                         for (int j = 0; j < 8; j++) {
//                             for (int x = 0; x < 8; x++) {
//                                 for (int y = 0; y < 8; y++) {
//                                     tmp[i][j] += (cc(x, y) * mcu[id][h][w][x][y] * cos((2*i+1)*M_PI/16.0*x) * cos((2*j+1)*M_PI/16.0*y));
//                                 }
//                             }
//                             tmp[i][j] /= 4.0;
//                         }
//                     }
					// 計算兩次一維idct去計算二維idct
                    double s[8][8] = {};
                    for (int j = 0; j < 8; j++) {
                        for (int x = 0; x < 8; x++) {
                            for (int y = 0; y < 8; y++) {
                                s[j][x] += c (y) * mcu[id][h][w][x][y] * cos_cache[(j + j + 1) * y];
                            }
                            s[j][x] = s[j][x] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            for (int x = 0; x < 8; x++) {
                                tmp[i][j] += c(x) * s[j][x] * cos_cache[(i + i + 1) * x];
                            }
                            tmp[i][j] = tmp[i][j] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = tmp[i][j];
                        }
                    }
                }
            }
        }
    }